

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

int64_t __thiscall
aeron::ClientConductor::addSubscription
          (ClientConductor *this,string *channel,int32_t streamId,
          on_available_image_t *onAvailableImageHandler,
          on_unavailable_image_t *onUnavailableImageHandler)

{
  int64_t iVar1;
  int64_t registrationId;
  int32_t local_44;
  int64_t local_40;
  longlong local_38;
  
  local_44 = streamId;
  verifyDriverIsActive(this);
  ensureOpen(this);
  std::recursive_mutex::lock(&this->m_adminLock);
  local_40 = DriverProxy::addSubscription(this->m_driverProxy,channel,streamId);
  local_38 = std::function<long_long_()>::operator()(&this->m_epochClock);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>
  ::
  emplace_back<std::__cxx11::string_const&,long&,int&,long_long,std::function<void(aeron::Image&)>const&,std::function<void(aeron::Image&)>const&>
            ((vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>
              *)&this->m_subscriptions,channel,&local_40,&local_44,&local_38,onAvailableImageHandler
             ,onUnavailableImageHandler);
  iVar1 = local_40;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return iVar1;
}

Assistant:

std::int64_t ClientConductor::addSubscription(
    const std::string &channel,
    std::int32_t streamId,
    const on_available_image_t &onAvailableImageHandler,
    const on_unavailable_image_t &onUnavailableImageHandler)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addSubscription(channel, streamId);

    m_subscriptions.emplace_back(
        channel, registrationId, streamId, m_epochClock(), onAvailableImageHandler, onUnavailableImageHandler);

    return registrationId;
}